

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_next_header_empty.c
# Opt level: O0

void test_empty_file2(void)

{
  int iVar1;
  archive *paVar2;
  archive *a;
  
  paVar2 = archive_read_new();
  iVar1 = archive_read_support_format_raw(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",
                      (void *)0x0);
  iVar1 = archive_read_support_format_empty(paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_empty(a)",
                      (void *)0x0);
  test_empty_file2_check(paVar2);
  paVar2 = archive_read_new();
  iVar1 = archive_read_support_format_by_code(paVar2,0x60000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_support_format_by_code(a, ARCHIVE_FORMAT_EMPTY)",(void *)0x0);
  test_empty_file2_check(paVar2);
  paVar2 = archive_read_new();
  iVar1 = archive_read_set_format(paVar2,0x60000);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_next_header_empty.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_set_format(a, ARCHIVE_FORMAT_EMPTY)",(void *)0x0);
  test_empty_file2_check(paVar2);
  return;
}

Assistant:

static void
test_empty_file2(void)
{
	struct archive* a = archive_read_new();

	/* Try opening an empty file with raw and empty handlers. */
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_raw(a));
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_empty(a));
	test_empty_file2_check(a);

	a = archive_read_new();
	assertEqualInt(ARCHIVE_OK, archive_read_support_format_by_code(a, ARCHIVE_FORMAT_EMPTY));
	test_empty_file2_check(a);

	a = archive_read_new();
	assertEqualInt(ARCHIVE_OK, archive_read_set_format(a, ARCHIVE_FORMAT_EMPTY));
	test_empty_file2_check(a);
}